

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkFinMiterCollect_rec(Abc_Obj_t *pObj,Vec_Int_t *vCis,Vec_Int_t *vNodes)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pObj_00;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vNodes_local;
  Vec_Int_t *vCis_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode( pObj )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                      ,0x1f7,
                      "void Abc_NtkFinMiterCollect_rec(Abc_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_2c);
        Abc_NtkFinMiterCollect_rec(pObj_00,vCis,vNodes);
      }
      uVar2 = Abc_ObjId(pObj);
      Vec_IntPush(vNodes,uVar2);
    }
    else {
      uVar2 = Abc_ObjId(pObj);
      Vec_IntPush(vCis,uVar2);
    }
  }
  return;
}

Assistant:

void Abc_NtkFinMiterCollect_rec( Abc_Obj_t * pObj, Vec_Int_t * vCis, Vec_Int_t * vNodes )
{
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Abc_ObjIsCi(pObj) )
        Vec_IntPush( vCis, Abc_ObjId(pObj) );
    else
    {
        Abc_Obj_t * pFanin; int i;
        assert( Abc_ObjIsNode( pObj ) );
        Abc_ObjForEachFanin( pObj, pFanin, i )
            Abc_NtkFinMiterCollect_rec( pFanin, vCis, vNodes );
        Vec_IntPush( vNodes, Abc_ObjId(pObj) );
    }
}